

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::
WriteValue<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>
          (Serializer *this,
          vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_true>
          *vec)

{
  pointer puVar1;
  unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *item;
  pointer puVar2;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (vec->
           super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (vec->
                super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    WriteValue<duckdb::Complex>
              (this,(puVar2->
                    super_unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>_>)._M_t.
                    super___uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>
                    .super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}